

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlareState.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::FlareState::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,FlareState *this)

{
  ostream *poVar1;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  FlareState *local_18;
  FlareState *this_local;
  
  local_18 = this;
  this_local = (FlareState *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  EnvironmentRecord::GetAsString_abi_cxx11_(&local_1c0,&this->super_EnvironmentRecord);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\tTime Since Creation:   ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32TSC);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tSource:                ");
  EntityType::GetAsString_abi_cxx11_(&local_1f0,&this->m_Src);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"\tNumber Intensity:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32NumInt);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tNumber Of Sources:     ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui32NumSrcs);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tGeometry Index:        ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16GeometryIndex);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString FlareState::GetAsString() const
{
    KStringStream ss;

    ss << EnvironmentRecord::GetAsString()
       << "\tTime Since Creation:   " << m_ui32TSC                 << "\n"
       << "\tSource:                " << m_Src.GetAsString()
       << "\tNumber Intensity:      " << m_ui32NumInt            << "\n"
       << "\tNumber Of Sources:     " << m_ui32NumSrcs          << "\n"
       << "\tGeometry Index:        " << m_ui16GeometryIndex   << "\n";

    return ss.str();
}